

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluateTest.hpp
# Opt level: O0

void Qentem::Test::TestEvaluate8(QTest *test)

{
  unsigned_long_long local_460;
  QNumber64 local_458;
  unsigned_long_long local_450;
  QNumber64 local_448;
  unsigned_long_long local_440;
  QNumber64 local_438;
  unsigned_long_long local_430;
  QNumber64 local_428;
  unsigned_long_long local_420;
  QNumber64 local_418;
  unsigned_long_long local_410;
  QNumber64 local_408;
  unsigned_long_long local_400;
  QNumber64 local_3f8;
  unsigned_long_long local_3f0;
  QNumber64 local_3e8;
  unsigned_long_long local_3e0;
  QNumber64 local_3d8;
  unsigned_long_long local_3d0;
  QNumber64 local_3c8;
  unsigned_long_long local_3c0;
  QNumber64 local_3b8;
  unsigned_long_long local_3b0;
  QNumber64 local_3a8;
  unsigned_long_long local_3a0;
  QNumber64 local_398;
  unsigned_long_long local_390;
  QNumber64 local_388;
  unsigned_long_long local_380;
  QNumber64 local_378;
  unsigned_long_long local_370;
  QNumber64 local_368;
  unsigned_long_long local_360;
  QNumber64 local_358;
  unsigned_long_long local_350;
  QNumber64 local_348;
  unsigned_long_long local_340;
  QNumber64 local_338;
  unsigned_long_long local_330;
  QNumber64 local_328;
  unsigned_long_long local_320;
  QNumber64 local_318;
  unsigned_long_long local_310;
  QNumber64 local_308;
  unsigned_long_long local_300;
  QNumber64 local_2f8;
  unsigned_long_long local_2f0;
  QNumber64 local_2e8;
  unsigned_long_long local_2e0;
  QNumber64 local_2d8;
  unsigned_long_long local_2d0;
  QNumber64 local_2c8;
  unsigned_long_long local_2c0;
  QNumber64 local_2b8;
  unsigned_long_long local_2b0;
  QNumber64 local_2a8;
  unsigned_long_long local_2a0;
  QNumber64 local_298;
  unsigned_long_long local_290;
  QNumber64 local_288;
  unsigned_long_long local_280;
  QNumber64 local_278;
  unsigned_long_long local_270;
  QNumber64 local_268;
  unsigned_long_long local_260;
  QNumber64 local_258;
  unsigned_long_long local_250;
  QNumber64 local_248;
  unsigned_long_long local_240;
  QNumber64 local_238;
  unsigned_long_long local_230;
  QNumber64 local_228;
  unsigned_long_long local_220;
  QNumber64 local_218;
  unsigned_long_long local_210;
  QNumber64 local_208;
  unsigned_long_long local_200;
  QNumber64 local_1f8;
  unsigned_long_long local_1f0;
  QNumber64 local_1e8;
  unsigned_long_long local_1e0 [3];
  QNumber64 local_1c8;
  unsigned_long_long local_1c0;
  QNumber64 local_1b8;
  unsigned_long_long local_1b0;
  QNumber64 local_1a8;
  unsigned_long_long local_1a0;
  QNumber64 local_198;
  unsigned_long_long local_190;
  QNumber64 local_188;
  unsigned_long_long local_180;
  QNumber64 local_178;
  unsigned_long_long local_170;
  QNumber64 local_168;
  unsigned_long_long local_160;
  QNumber64 local_158;
  double local_150;
  QNumber64 local_148;
  double local_140;
  QNumber64 local_138;
  int local_12c;
  QNumber64 local_128;
  unsigned_long_long local_120;
  QNumber64 local_118;
  double local_110;
  QNumber64 local_108;
  double local_100;
  QNumber64 local_f8;
  int local_ec;
  QNumber64 local_e8;
  unsigned_long_long local_e0;
  QNumber64 local_d8;
  double local_d0;
  QNumber64 local_c8;
  double local_c0;
  QNumber64 local_b8;
  unsigned_long_long local_b0;
  QNumber64 local_a8;
  unsigned_long_long local_a0;
  QNumber64 local_98;
  double local_90;
  QNumber64 local_88;
  double local_80;
  QNumber64 local_78;
  unsigned_long_long local_70;
  QNumber64 local_68;
  unsigned_long_long local_60;
  QNumber64 local_58;
  unsigned_long_long local_50;
  QNumber64 local_48;
  byte local_39;
  char *pcStack_38;
  bool is_valid;
  char *content;
  QNumber64 number;
  Value<char> value;
  QTest *test_local;
  
  value._16_8_ = test;
  Value<char>::Value((Value<char> *)&number);
  QNumber64::QNumber64<int>((QNumber64 *)&content,-1);
  pcStack_38 = "3*2^3";
  local_48 = TestEvaluate("3*2^3",(Value<char> *)&number);
  local_50 = 0x18;
  content = (char *)local_48;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_50,0x689);
  pcStack_38 = "3*2^2+1";
  local_58 = TestEvaluate("3*2^2+1",(Value<char> *)&number);
  local_60 = 0xd;
  content = (char *)local_58;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_60,0x68d);
  pcStack_38 = "3*10%7";
  local_68 = TestEvaluate("3*10%7",(Value<char> *)&number);
  local_70 = 9;
  content = (char *)local_68;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_70,0x691);
  pcStack_38 = "135/3^3";
  local_78 = TestEvaluate("135/3^3",(Value<char> *)&number);
  local_80 = 5.0;
  content = (char *)local_78;
  QTest::IsEqual<double,double>((QTest *)value._16_8_,(double *)&content,&local_80,0x695);
  pcStack_38 = "18/10%7";
  local_88 = TestEvaluate("18/10%7",(Value<char> *)&number);
  local_90 = 6.0;
  content = (char *)local_88;
  QTest::IsEqual<double,double>((QTest *)value._16_8_,(double *)&content,&local_90,0x699);
  pcStack_38 = "4^2*2";
  local_98 = TestEvaluate("4^2*2",(Value<char> *)&number);
  local_a0 = 0x20;
  content = (char *)local_98;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_a0,0x69d);
  pcStack_38 = "10%7*2";
  local_a8 = TestEvaluate("10%7*2",(Value<char> *)&number);
  local_b0 = 6;
  content = (char *)local_a8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_b0,0x6a1);
  pcStack_38 = "3^3/4";
  local_b8 = TestEvaluate("3^3/4",(Value<char> *)&number);
  local_c0 = 6.75;
  content = (char *)local_b8;
  QTest::IsEqual<double,double>((QTest *)value._16_8_,(double *)&content,&local_c0,0x6a5);
  pcStack_38 = "10%4/2";
  local_c8 = TestEvaluate("10%4/2",(Value<char> *)&number);
  local_d0 = 1.0;
  content = (char *)local_c8;
  QTest::IsEqual<double,double>((QTest *)value._16_8_,(double *)&content,&local_d0,0x6a9);
  pcStack_38 = "4+2*2";
  local_d8 = TestEvaluate("4+2*2",(Value<char> *)&number);
  local_e0 = 8;
  content = (char *)local_d8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_e0,0x6ad);
  pcStack_38 = "10-7*2";
  local_e8 = TestEvaluate("10-7*2",(Value<char> *)&number);
  local_ec = -4;
  content = (char *)local_e8;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_ec,0x6b1);
  pcStack_38 = "3+16/4";
  local_f8 = TestEvaluate("3+16/4",(Value<char> *)&number);
  local_100 = 7.0;
  content = (char *)local_f8;
  QTest::IsEqual<double,double>((QTest *)value._16_8_,(double *)&content,&local_100,0x6b5);
  pcStack_38 = "10-6/3";
  local_108 = TestEvaluate("10-6/3",(Value<char> *)&number);
  local_110 = 8.0;
  content = (char *)local_108;
  QTest::IsEqual<double,double>((QTest *)value._16_8_,(double *)&content,&local_110,0x6b9);
  pcStack_38 = "2*8-2";
  local_118 = TestEvaluate("2*8-2",(Value<char> *)&number);
  local_120 = 0xe;
  content = (char *)local_118;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_120,0x6bd);
  pcStack_38 = "3*4-20";
  local_128 = TestEvaluate("3*4-20",(Value<char> *)&number);
  local_12c = -8;
  content = (char *)local_128;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_12c,0x6c1);
  pcStack_38 = "14/7+3";
  local_138 = TestEvaluate("14/7+3",(Value<char> *)&number);
  local_140 = 5.0;
  content = (char *)local_138;
  QTest::IsEqual<double,double>((QTest *)value._16_8_,(double *)&content,&local_140,0x6c5);
  pcStack_38 = "9/3-4";
  local_148 = TestEvaluate("9/3-4",(Value<char> *)&number);
  local_150 = -1.0;
  content = (char *)local_148;
  QTest::IsEqual<double,double>((QTest *)value._16_8_,(double *)&content,&local_150,0x6c9);
  pcStack_38 = "3+4==7";
  local_158 = TestEvaluate("3+4==7",(Value<char> *)&number);
  local_160 = 1;
  content = (char *)local_158;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_160,0x6cd);
  pcStack_38 = "7-8==-1";
  local_168 = TestEvaluate("7-8==-1",(Value<char> *)&number);
  local_170 = 1;
  content = (char *)local_168;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_170,0x6d1);
  pcStack_38 = "8-2!=2";
  local_178 = TestEvaluate("8-2!=2",(Value<char> *)&number);
  local_180 = 1;
  content = (char *)local_178;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_180,0x6d5);
  pcStack_38 = "7+3!=3";
  local_188 = TestEvaluate("7+3!=3",(Value<char> *)&number);
  local_190 = 1;
  content = (char *)local_188;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_190,0x6d9);
  pcStack_38 = "7==3+4";
  local_198 = TestEvaluate("7==3+4",(Value<char> *)&number);
  local_1a0 = 1;
  content = (char *)local_198;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_1a0,0x6dd);
  pcStack_38 = "-1==7-8";
  local_1a8 = TestEvaluate("-1==7-8",(Value<char> *)&number);
  local_1b0 = 1;
  content = (char *)local_1a8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_1b0,0x6e1);
  pcStack_38 = "8!=8-2";
  local_1b8 = TestEvaluate("8!=8-2",(Value<char> *)&number);
  local_1c0 = 1;
  content = (char *)local_1b8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_1c0,0x6e5);
  pcStack_38 = "7!=7+3";
  local_1c8 = TestEvaluate("7!=7+3",(Value<char> *)&number);
  local_1e0[2] = 1;
  content = (char *)local_1c8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,local_1e0 + 2,0x6e9);
  pcStack_38 = "7!=10-3";
  local_39 = TestEvaluate((QNumber64 *)&content,"7!=10-3",(Value<char> *)&number);
  local_1e0[1] = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,local_1e0 + 1,0x6ed);
  QTest::IsTrue((QTest *)value._16_8_,(bool)(local_39 & 1),0x6ee);
  pcStack_38 = "7-10!=-3";
  local_39 = TestEvaluate((QNumber64 *)&content,"7-10!=-3",(Value<char> *)&number);
  local_1e0[0] = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,local_1e0,0x6f2);
  QTest::IsTrue((QTest *)value._16_8_,(bool)(local_39 & 1),0x6f3);
  pcStack_38 = "3+4>=7";
  local_1e8 = TestEvaluate("3+4>=7",(Value<char> *)&number);
  local_1f0 = 1;
  content = (char *)local_1e8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_1f0,0x6f7);
  pcStack_38 = "3-8>-10";
  local_1f8 = TestEvaluate("3-8>-10",(Value<char> *)&number);
  local_200 = 1;
  content = (char *)local_1f8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_200,0x6fb);
  pcStack_38 = "8-2<10";
  local_208 = TestEvaluate("8-2<10",(Value<char> *)&number);
  local_210 = 1;
  content = (char *)local_208;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_210,0x6ff);
  pcStack_38 = "7+3<=10";
  local_218 = TestEvaluate("7+3<=10",(Value<char> *)&number);
  local_220 = 1;
  content = (char *)local_218;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_220,0x703);
  pcStack_38 = "7<=3+4";
  local_228 = TestEvaluate("7<=3+4",(Value<char> *)&number);
  local_230 = 1;
  content = (char *)local_228;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_230,0x707);
  pcStack_38 = "-1<7+8";
  local_238 = TestEvaluate("-1<7+8",(Value<char> *)&number);
  local_240 = 1;
  content = (char *)local_238;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_240,0x70b);
  pcStack_38 = "8>8-2";
  local_248 = TestEvaluate("8>8-2",(Value<char> *)&number);
  local_250 = 1;
  content = (char *)local_248;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_250,0x70f);
  pcStack_38 = "7>=10-3";
  local_258 = TestEvaluate("7>=10-3",(Value<char> *)&number);
  local_260 = 1;
  content = (char *)local_258;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_260,0x713);
  pcStack_38 = "1&&1==1";
  local_268 = TestEvaluate("1&&1==1",(Value<char> *)&number);
  local_270 = 1;
  content = (char *)local_268;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_270,0x717);
  pcStack_38 = "1&&10==10";
  local_278 = TestEvaluate("1&&10==10",(Value<char> *)&number);
  local_280 = 1;
  content = (char *)local_278;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_280,0x71b);
  pcStack_38 = "1&&5!=1";
  local_288 = TestEvaluate("1&&5!=1",(Value<char> *)&number);
  local_290 = 1;
  content = (char *)local_288;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_290,0x71f);
  pcStack_38 = "1&&7!=1";
  local_298 = TestEvaluate("1&&7!=1",(Value<char> *)&number);
  local_2a0 = 1;
  content = (char *)local_298;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2a0,0x723);
  pcStack_38 = "0==0&&1";
  local_2a8 = TestEvaluate("0==0&&1",(Value<char> *)&number);
  local_2b0 = 1;
  content = (char *)local_2a8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2b0,0x727);
  pcStack_38 = "1==1&&1";
  local_2b8 = TestEvaluate("1==1&&1",(Value<char> *)&number);
  local_2c0 = 1;
  content = (char *)local_2b8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2c0,0x72b);
  pcStack_38 = "1!=0&&1";
  local_2c8 = TestEvaluate("1!=0&&1",(Value<char> *)&number);
  local_2d0 = 1;
  content = (char *)local_2c8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2d0,0x72f);
  pcStack_38 = "0!=1&&1";
  local_2d8 = TestEvaluate("0!=1&&1",(Value<char> *)&number);
  local_2e0 = 1;
  content = (char *)local_2d8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2e0,0x733);
  pcStack_38 = "1||10==1";
  local_2e8 = TestEvaluate("1||10==1",(Value<char> *)&number);
  local_2f0 = 1;
  content = (char *)local_2e8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2f0,0x737);
  pcStack_38 = "0||10==10";
  local_2f8 = TestEvaluate("0||10==10",(Value<char> *)&number);
  local_300 = 1;
  content = (char *)local_2f8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_300,0x73b);
  pcStack_38 = "1||5!=1";
  local_308 = TestEvaluate("1||5!=1",(Value<char> *)&number);
  local_310 = 1;
  content = (char *)local_308;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_310,0x73f);
  pcStack_38 = "0||7!=1";
  local_318 = TestEvaluate("0||7!=1",(Value<char> *)&number);
  local_320 = 1;
  content = (char *)local_318;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_320,0x743);
  pcStack_38 = "0==0||1";
  local_328 = TestEvaluate("0==0||1",(Value<char> *)&number);
  local_330 = 1;
  content = (char *)local_328;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_330,0x747);
  pcStack_38 = "1==1||0";
  local_338 = TestEvaluate("1==1||0",(Value<char> *)&number);
  local_340 = 1;
  content = (char *)local_338;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_340,0x74b);
  pcStack_38 = "1!=0||1";
  local_348 = TestEvaluate("1!=0||1",(Value<char> *)&number);
  local_350 = 1;
  content = (char *)local_348;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_350,0x74f);
  pcStack_38 = "0!=1||0";
  local_358 = TestEvaluate("0!=1||0",(Value<char> *)&number);
  local_360 = 1;
  content = (char *)local_358;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_360,0x753);
  pcStack_38 = "1&&1<=1";
  local_368 = TestEvaluate("1&&1<=1",(Value<char> *)&number);
  local_370 = 1;
  content = (char *)local_368;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_370,0x757);
  pcStack_38 = "1&&3<10";
  local_378 = TestEvaluate("1&&3<10",(Value<char> *)&number);
  local_380 = 1;
  content = (char *)local_378;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_380,0x75b);
  pcStack_38 = "1&&5>1";
  local_388 = TestEvaluate("1&&5>1",(Value<char> *)&number);
  local_390 = 1;
  content = (char *)local_388;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_390,0x75f);
  pcStack_38 = "1&&0>=0";
  local_398 = TestEvaluate("1&&0>=0",(Value<char> *)&number);
  local_3a0 = 1;
  content = (char *)local_398;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_3a0,0x763);
  pcStack_38 = "0<=0&&1";
  local_3a8 = TestEvaluate("0<=0&&1",(Value<char> *)&number);
  local_3b0 = 1;
  content = (char *)local_3a8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_3b0,0x767);
  pcStack_38 = "1<2&&1";
  local_3b8 = TestEvaluate("1<2&&1",(Value<char> *)&number);
  local_3c0 = 1;
  content = (char *)local_3b8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_3c0,0x76b);
  pcStack_38 = "1>0&&1";
  local_3c8 = TestEvaluate("1>0&&1",(Value<char> *)&number);
  local_3d0 = 1;
  content = (char *)local_3c8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_3d0,0x76f);
  pcStack_38 = "10>=5&&1";
  local_3d8 = TestEvaluate("10>=5&&1",(Value<char> *)&number);
  local_3e0 = 1;
  content = (char *)local_3d8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_3e0,0x773);
  pcStack_38 = "1||10<=1";
  local_3e8 = TestEvaluate("1||10<=1",(Value<char> *)&number);
  local_3f0 = 1;
  content = (char *)local_3e8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_3f0,0x777);
  pcStack_38 = "0||1<10";
  local_3f8 = TestEvaluate("0||1<10",(Value<char> *)&number);
  local_400 = 1;
  content = (char *)local_3f8;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_400,0x77b);
  pcStack_38 = "1||5>=10";
  local_408 = TestEvaluate("1||5>=10",(Value<char> *)&number);
  local_410 = 1;
  content = (char *)local_408;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_410,0x77f);
  pcStack_38 = "0||7>1";
  local_418 = TestEvaluate("0||7>1",(Value<char> *)&number);
  local_420 = 1;
  content = (char *)local_418;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_420,0x783);
  pcStack_38 = "0>=0||1";
  local_428 = TestEvaluate("0>=0||1",(Value<char> *)&number);
  local_430 = 1;
  content = (char *)local_428;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_430,0x787);
  pcStack_38 = "4>3||0";
  local_438 = TestEvaluate("4>3||0",(Value<char> *)&number);
  local_440 = 1;
  content = (char *)local_438;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_440,0x78b);
  pcStack_38 = "1<0||1";
  local_448 = TestEvaluate("1<0||1",(Value<char> *)&number);
  local_450 = 1;
  content = (char *)local_448;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_450,0x78f);
  pcStack_38 = "0<1||0";
  local_458 = TestEvaluate("0<1||0",(Value<char> *)&number);
  local_460 = 1;
  content = (char *)local_458;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_460,0x793);
  Value<char>::~Value((Value<char> *)&number);
  return;
}

Assistant:

static void TestEvaluate8(QTest &test) {
    const Value<char> value{};
    QNumber64         number{-1};
    const char       *content;
    bool              is_valid;

    content = "3*2^3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 24ULL, __LINE__);

    content = "3*2^2+1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 13ULL, __LINE__);

    content = "3*10%7";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 9ULL, __LINE__);

    content = "135/3^3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 5.0, __LINE__);

    content = "18/10%7";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 6.0, __LINE__);

    content = "4^2*2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 32ULL, __LINE__);

    content = "10%7*2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 6ULL, __LINE__);

    content = "3^3/4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 6.75, __LINE__);

    content = "10%4/2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 1.0, __LINE__);

    content = "4+2*2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 8ULL, __LINE__);

    content = "10-7*2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -4, __LINE__);

    content = "3+16/4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 7.0, __LINE__);

    content = "10-6/3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 8.0, __LINE__);

    content = "2*8-2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 14ULL, __LINE__);

    content = "3*4-20";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -8, __LINE__);

    content = "14/7+3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, 5.0, __LINE__);

    content = "9/3-4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Real, -1.0, __LINE__);

    content = "3+4==7";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7-8==-1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "8-2!=2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7+3!=3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7==3+4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "-1==7-8";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "8!=8-2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7!=7+3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content  = "7!=10-3";
    is_valid = TestEvaluate(number, content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);
    test.IsTrue(is_valid, __LINE__);

    content  = "7-10!=-3";
    is_valid = TestEvaluate(number, content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);
    test.IsTrue(is_valid, __LINE__);

    content = "3+4>=7";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "3-8>-10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "8-2<10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7+3<=10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7<=3+4";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "-1<7+8";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "8>8-2";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "7>=10-3";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&1==1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&10==10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&5!=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&7!=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0==0&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1==1&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1!=0&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0!=1&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1||10==1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0||10==10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1||5!=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0||7!=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0==0||1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1==1||0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1!=0||1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0!=1||0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&1<=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&3<10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&5>1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1&&0>=0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0<=0&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1<2&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1>0&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "10>=5&&1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1||10<=1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0||1<10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1||5>=10";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0||7>1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0>=0||1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "4>3||0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "1<0||1";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "0<1||0";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);
}